

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RationalTangentialDistortion::invTransform
          (RationalTangentialDistortion *this,double *xd,double *yd,double xx,double yy)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double dtmp [16];
  long ltmp [2];
  double fvec [2];
  RationalTangentialDistortionParameter param;
  double x [2];
  undefined1 local_128 [128];
  undefined1 local_a8 [32];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_30 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_88 = *(undefined8 *)(in_RDI + 8);
  local_80 = *(undefined8 *)(in_RDI + 0x10);
  local_78 = *(undefined8 *)(in_RDI + 0x18);
  local_70 = *(undefined8 *)(in_RDI + 0x20);
  local_68 = *(undefined8 *)(in_RDI + 0x28);
  local_60 = *(undefined8 *)(in_RDI + 0x30);
  local_58 = *(undefined8 *)(in_RDI + 0x38);
  local_50 = *(undefined8 *)(in_RDI + 0x40);
  local_38 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(local_a8,0,0x10);
  memset(local_128,0,0x80);
  slmdif((lmdifFct)dtmp[8],dtmp[7]._4_4_,dtmp[7]._0_4_,(double *)dtmp[6],(double *)dtmp[5],
         (void *)dtmp[4],dtmp[3],dtmp[2],(long *)ltmp[0],(double *)ltmp[1]);
  *local_10 = local_38;
  *local_18 = local_30;
  return;
}

Assistant:

void RationalTangentialDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  double x[2]= {xx, yy};

  RationalTangentialDistortionParameter param;

  param.p1=kd[0];
  param.p2=kd[1];
  param.kd[0]=kd[2];
  param.kd[1]=kd[3];
  param.kd[2]=kd[4];
  param.kd[3]=kd[5];
  param.kd[4]=kd[6];
  param.kd[5]=kd[7];
  param.xd=xx;
  param.yd=yy;

  double fvec[2];

  long ltmp[2]= {0, 0};
  double dtmp[16];

  memset(dtmp, 0, 16*sizeof(double));
  gmath::slmdif(computeRationalTangentialDistortion, 2, 2, x, fvec, &param, 1e-6, 0, ltmp, dtmp);

  xd=x[0];
  yd=x[1];
}